

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

bool make_old_bright_enough(Am_Style *old,float *y,float *i,float *q)

{
  byte bVar1;
  float blue;
  float green;
  float red;
  float local_3c;
  float local_38;
  float local_34;
  
  Am_Style::Get_Values(old,&local_34,&local_38,&local_3c);
  if ((((local_34 == 1.0) && (!NAN(local_34))) || ((local_3c == 1.0 && (!NAN(local_3c))))) ||
     ((local_38 == 1.0 && (!NAN(local_38))))) {
    bVar1 = local_38 == 0.0 | -(local_34 == 0.0) | -(local_3c == 0.0);
  }
  else {
    bVar1 = 0;
  }
  *y = local_3c * 0.11 + local_34 * 0.3 + local_38 * 0.59;
  *i = local_3c * -0.32 + local_34 * 0.6 + local_38 * -0.28;
  *q = local_3c * 0.31 + local_34 * 0.21 + local_38 * -0.52;
  if (*y < 0.4) {
    *y = 0.4;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool
make_old_bright_enough(const Am_Style &old, float &y, float &i, float &q)
{
  float red, green, blue;
  old.Get_Values(red, green, blue);
  //if one of the "pure" colors, then adjust highlight color so will show up
  bool saturated = ((red == 1.0f || blue == 1.0f || green == 1.0f) &&
                    (red == 0.0f || blue == 0.0f || green == 0.0f));
  //  std::cout << "   rgb=" << red << "," << green << "," << blue <<std::endl <<std::flush;
  y = (red * 0.3f) + (green * 0.59f) + (blue * 0.11f);
  i = (red * 0.6f) + (green * -0.28f) + (blue * -0.32f);
  q = (red * 0.21f) + (green * -0.52f) + (blue * 0.31f);
  if (y < MIN_ACCEPTABLE_BRIGHTNESS) {
    //    std::cout << "   old Y " << y << " too dark\n" <<std::flush;
    y = static_cast<float>(MIN_ACCEPTABLE_BRIGHTNESS);
  }
  return saturated;
}